

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O3

void secp256k1_ecmult_odd_multiples_table
               (int n,secp256k1_ge *pre_a,secp256k1_fe *zr,secp256k1_fe *z,secp256k1_gej *a)

{
  uint64_t *puVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  uint64_t uVar284;
  uint64_t uVar285;
  uint64_t uVar286;
  uint64_t uVar287;
  uint64_t uVar288;
  ulong uVar289;
  ulong uVar290;
  ulong uVar291;
  ulong uVar292;
  ulong uVar293;
  long lVar294;
  ulong uVar295;
  ulong uVar296;
  ulong uVar297;
  ulong uVar298;
  ulong uVar299;
  ulong uVar300;
  ulong uVar301;
  ulong uVar302;
  secp256k1_ge d_ge;
  secp256k1_gej local_188;
  secp256k1_gej local_108;
  secp256k1_ge local_88;
  
  iVar2 = a->infinity;
  if (iVar2 == 0) {
    secp256k1_gej_double(&local_108,a);
  }
  else {
    local_108.z.n[2] = 0;
    local_108.z.n[3] = 0;
    local_108.z.n[0] = 0;
    local_108.z.n[1] = 0;
    local_108.y.n[3] = 0;
    local_108.y.n[4] = 0;
    local_108.y.n[1] = 0;
    local_108.y.n[2] = 0;
    local_108.x.n[4] = 0;
    local_108.y.n[0] = 0;
    local_108.x.n[2] = 0;
    local_108.x.n[3] = 0;
    local_108.x.n[0] = 0;
    local_108.x.n[1] = 0;
    local_108.z.n[4] = 0;
  }
  uVar288 = local_108.z.n[4];
  uVar287 = local_108.z.n[3];
  uVar286 = local_108.z.n[2];
  uVar285 = local_108.z.n[1];
  uVar284 = local_108.z.n[0];
  uVar293 = local_108.z.n[0] * 2;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_108.z.n[3];
  auVar151._8_8_ = 0;
  auVar151._0_8_ = uVar293;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_108.z.n[2];
  auVar152._8_8_ = 0;
  auVar152._0_8_ = local_108.z.n[1] * 2;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_108.z.n[4];
  auVar153._8_8_ = 0;
  auVar153._0_8_ = local_108.z.n[4];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = SUB168(auVar8 * auVar153,0);
  auVar6 = auVar9 * ZEXT816(0x1000003d10) + auVar7 * auVar152 + auVar6 * auVar151;
  uVar298 = local_108.z.n[4] * 2;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar298;
  auVar154._8_8_ = 0;
  auVar154._0_8_ = local_108.z.n[0];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_108.z.n[3];
  auVar155._8_8_ = 0;
  auVar155._0_8_ = local_108.z.n[1] * 2;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_108.z.n[2];
  auVar156._8_8_ = 0;
  auVar156._0_8_ = local_108.z.n[2];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = SUB168(auVar8 * auVar153,8);
  auVar9 = auVar13 * ZEXT816(0x1000003d10000) +
           auVar10 * auVar154 + auVar12 * auVar156 + auVar11 * auVar155 + (auVar6 >> 0x34);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_108.z.n[0];
  auVar157._8_8_ = 0;
  auVar157._0_8_ = local_108.z.n[0];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar298;
  auVar158._8_8_ = 0;
  auVar158._0_8_ = local_108.z.n[1];
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_108.z.n[3];
  auVar159._8_8_ = 0;
  auVar159._0_8_ = local_108.z.n[2] * 2;
  auVar7 = auVar16 * auVar159 + auVar15 * auVar158 + (auVar9 >> 0x34);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = (auVar7._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar9._6_2_ & 0xf);
  auVar8 = auVar17 * ZEXT816(0x1000003d1) + auVar14 * auVar157;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = local_108.z.n[1];
  auVar160._8_8_ = 0;
  auVar160._0_8_ = uVar293;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar298;
  auVar161._8_8_ = 0;
  auVar161._0_8_ = local_108.z.n[2];
  auVar20._8_8_ = 0;
  auVar20._0_8_ = local_108.z.n[3];
  auVar162._8_8_ = 0;
  auVar162._0_8_ = local_108.z.n[3];
  auVar7 = auVar19 * auVar161 + auVar20 * auVar162 + (auVar7 >> 0x34);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = auVar7._0_8_ & 0xfffffffffffff;
  auVar10 = auVar21 * ZEXT816(0x1000003d10) + auVar18 * auVar160 + (auVar8 >> 0x34);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local_108.z.n[2];
  auVar163._8_8_ = 0;
  auVar163._0_8_ = uVar293;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = local_108.z.n[1];
  auVar164._8_8_ = 0;
  auVar164._0_8_ = local_108.z.n[1];
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar298;
  auVar165._8_8_ = 0;
  auVar165._0_8_ = local_108.z.n[3];
  auVar7 = auVar24 * auVar165 + (auVar7 >> 0x34);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = auVar7._0_8_;
  auVar11 = auVar25 * ZEXT816(0x1000003d10) + auVar23 * auVar164 + auVar22 * auVar163 +
            (auVar10 >> 0x34);
  auVar12 = auVar11 >> 0x34;
  auVar272._8_8_ = auVar12._8_8_;
  auVar272._0_8_ = auVar6._0_8_ & 0xffffffffffffe;
  auVar273._8_8_ = 0;
  auVar273._0_8_ = auVar12._0_8_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = auVar7._8_8_;
  auVar273 = auVar26 * ZEXT816(0x1000003d10000) + auVar272 + auVar273;
  uVar299 = auVar273._0_8_;
  uVar289 = auVar8._0_8_ & 0xfffffffffffff;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar289;
  auVar166._8_8_ = 0;
  auVar166._0_8_ = local_108.z.n[3];
  uVar296 = (auVar273._8_8_ << 0xc | uVar299 >> 0x34) + (auVar9._0_8_ & 0xffffffffffff);
  uVar297 = auVar10._0_8_ & 0xfffffffffffff;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar297;
  auVar167._8_8_ = 0;
  auVar167._0_8_ = local_108.z.n[2];
  uVar301 = auVar11._0_8_ & 0xfffffffffffff;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar301;
  auVar168._8_8_ = 0;
  auVar168._0_8_ = local_108.z.n[1];
  uVar299 = uVar299 & 0xfffffffffffff;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar299;
  auVar169._8_8_ = 0;
  auVar169._0_8_ = local_108.z.n[0];
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar296;
  auVar170._8_8_ = 0;
  auVar170._0_8_ = local_108.z.n[4];
  auVar32._8_8_ = 0;
  auVar32._0_8_ = SUB168(auVar31 * auVar170,0);
  auVar6 = auVar32 * ZEXT816(0x1000003d10) +
           auVar28 * auVar167 + auVar27 * auVar166 + auVar29 * auVar168 + auVar30 * auVar169;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar289;
  auVar171._8_8_ = 0;
  auVar171._0_8_ = local_108.z.n[4];
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar297;
  auVar172._8_8_ = 0;
  auVar172._0_8_ = local_108.z.n[3];
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar301;
  auVar173._8_8_ = 0;
  auVar173._0_8_ = local_108.z.n[2];
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar299;
  auVar174._8_8_ = 0;
  auVar174._0_8_ = local_108.z.n[1];
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uVar296;
  auVar175._8_8_ = 0;
  auVar175._0_8_ = local_108.z.n[0];
  auVar38._8_8_ = 0;
  auVar38._0_8_ = SUB168(auVar31 * auVar170,8);
  auVar9 = auVar38 * ZEXT816(0x1000003d10000) +
           auVar37 * auVar175 +
           auVar36 * auVar174 + auVar35 * auVar173 + auVar33 * auVar171 + auVar34 * auVar172 +
           (auVar6 >> 0x34);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uVar289;
  auVar176._8_8_ = 0;
  auVar176._0_8_ = local_108.z.n[0];
  auVar40._8_8_ = 0;
  auVar40._0_8_ = uVar297;
  auVar177._8_8_ = 0;
  auVar177._0_8_ = local_108.z.n[4];
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uVar301;
  auVar178._8_8_ = 0;
  auVar178._0_8_ = local_108.z.n[3];
  auVar42._8_8_ = 0;
  auVar42._0_8_ = uVar299;
  auVar179._8_8_ = 0;
  auVar179._0_8_ = local_108.z.n[2];
  auVar43._8_8_ = 0;
  auVar43._0_8_ = uVar296;
  auVar180._8_8_ = 0;
  auVar180._0_8_ = local_108.z.n[1];
  auVar7 = auVar43 * auVar180 + auVar42 * auVar179 + auVar41 * auVar178 + auVar40 * auVar177 +
           (auVar9 >> 0x34);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = (auVar7._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar9._6_2_ & 0xf);
  auVar8 = auVar39 * auVar176 + auVar44 * ZEXT816(0x1000003d1);
  uVar290 = auVar8._0_8_;
  uVar293 = auVar8._8_8_;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uVar289;
  auVar181._8_8_ = 0;
  auVar181._0_8_ = local_108.z.n[1];
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uVar297;
  auVar182._8_8_ = 0;
  auVar182._0_8_ = local_108.z.n[0];
  auVar266._8_8_ = uVar293 >> 0x34;
  auVar266._0_8_ = uVar293 * 0x1000 | uVar290 >> 0x34;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = uVar301;
  auVar183._8_8_ = 0;
  auVar183._0_8_ = local_108.z.n[4];
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar299;
  auVar184._8_8_ = 0;
  auVar184._0_8_ = local_108.z.n[3];
  auVar49._8_8_ = 0;
  auVar49._0_8_ = uVar296;
  auVar185._8_8_ = 0;
  auVar185._0_8_ = local_108.z.n[2];
  auVar7 = auVar49 * auVar185 + auVar48 * auVar184 + auVar47 * auVar183 + (auVar7 >> 0x34);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = auVar7._0_8_ & 0xfffffffffffff;
  auVar266 = auVar50 * ZEXT816(0x1000003d10) + auVar45 * auVar181 + auVar46 * auVar182 + auVar266;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = uVar289;
  auVar186._8_8_ = 0;
  auVar186._0_8_ = local_108.z.n[2];
  auVar52._8_8_ = 0;
  auVar52._0_8_ = uVar297;
  auVar187._8_8_ = 0;
  auVar187._0_8_ = local_108.z.n[1];
  auVar53._8_8_ = 0;
  auVar53._0_8_ = uVar301;
  auVar188._8_8_ = 0;
  auVar188._0_8_ = local_108.z.n[0];
  auVar54._8_8_ = 0;
  auVar54._0_8_ = uVar299;
  auVar189._8_8_ = 0;
  auVar189._0_8_ = local_108.z.n[4];
  auVar55._8_8_ = 0;
  auVar55._0_8_ = uVar296;
  auVar190._8_8_ = 0;
  auVar190._0_8_ = local_108.z.n[3];
  auVar7 = auVar55 * auVar190 + auVar54 * auVar189 + (auVar7 >> 0x34);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = auVar7._0_8_;
  auVar8 = auVar56 * ZEXT816(0x1000003d10) +
           auVar53 * auVar188 + auVar52 * auVar187 + auVar51 * auVar186 + (auVar266 >> 0x34);
  local_88.infinity = 0;
  auVar10 = auVar8 >> 0x34;
  auVar275._8_8_ = 0;
  auVar275._0_8_ = auVar10._0_8_;
  local_88.x.n[4] = local_108.x.n[4];
  auVar57._8_8_ = 0;
  auVar57._0_8_ = auVar7._8_8_;
  auVar274._8_8_ = auVar10._8_8_;
  auVar274._0_8_ = auVar6._0_8_ & 0xfffffffffffff;
  local_88.x.n[0] = local_108.x.n[0];
  local_88.x.n[1] = local_108.x.n[1];
  local_88.x.n[2] = local_108.x.n[2];
  local_88.x.n[3] = local_108.x.n[3];
  local_88.y.n[4] = local_108.y.n[4];
  auVar275 = auVar57 * ZEXT816(0x1000003d10000) + auVar274 + auVar275;
  uVar291 = auVar275._0_8_;
  local_88.y.n[0] = local_108.y.n[0];
  local_88.y.n[1] = local_108.y.n[1];
  local_88.y.n[2] = local_108.y.n[2];
  local_88.y.n[3] = local_108.y.n[3];
  uVar293 = (a->x).n[0];
  auVar58._8_8_ = 0;
  auVar58._0_8_ = uVar299;
  auVar191._8_8_ = 0;
  auVar191._0_8_ = uVar293;
  uVar298 = (a->x).n[1];
  auVar59._8_8_ = 0;
  auVar59._0_8_ = uVar301;
  auVar192._8_8_ = 0;
  auVar192._0_8_ = uVar298;
  uVar3 = (a->x).n[2];
  auVar60._8_8_ = 0;
  auVar60._0_8_ = uVar297;
  auVar193._8_8_ = 0;
  auVar193._0_8_ = uVar3;
  uVar4 = (a->x).n[3];
  auVar61._8_8_ = 0;
  auVar61._0_8_ = uVar289;
  auVar194._8_8_ = 0;
  auVar194._0_8_ = uVar4;
  uVar5 = (a->x).n[4];
  auVar62._8_8_ = 0;
  auVar62._0_8_ = uVar296;
  auVar195._8_8_ = 0;
  auVar195._0_8_ = uVar5;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = SUB168(auVar62 * auVar195,0);
  uVar300 = (auVar275._8_8_ << 0xc | uVar291 >> 0x34) + (auVar9._0_8_ & 0xffffffffffff);
  auVar6 = auVar63 * ZEXT816(0x1000003d10) +
           auVar61 * auVar194 + auVar60 * auVar193 + auVar59 * auVar192 + auVar58 * auVar191;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = uVar296;
  auVar196._8_8_ = 0;
  auVar196._0_8_ = uVar293;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = uVar299;
  auVar197._8_8_ = 0;
  auVar197._0_8_ = uVar298;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = uVar301;
  auVar198._8_8_ = 0;
  auVar198._0_8_ = uVar3;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = uVar297;
  auVar199._8_8_ = 0;
  auVar199._0_8_ = uVar4;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = uVar289;
  auVar200._8_8_ = 0;
  auVar200._0_8_ = uVar5;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = SUB168(auVar62 * auVar195,8);
  auVar7 = auVar69 * ZEXT816(0x1000003d10000) +
           auVar65 * auVar197 + auVar66 * auVar198 + auVar68 * auVar200 + auVar67 * auVar199 +
           auVar64 * auVar196 + (auVar6 >> 0x34);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = uVar289;
  auVar201._8_8_ = 0;
  auVar201._0_8_ = uVar293;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = uVar296;
  auVar202._8_8_ = 0;
  auVar202._0_8_ = uVar298;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = uVar299;
  auVar203._8_8_ = 0;
  auVar203._0_8_ = uVar3;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = uVar301;
  auVar204._8_8_ = 0;
  auVar204._0_8_ = uVar4;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = uVar297;
  auVar205._8_8_ = 0;
  auVar205._0_8_ = uVar5;
  auVar9 = (auVar7 >> 0x34) +
           auVar74 * auVar205 + auVar73 * auVar204 + auVar72 * auVar203 + auVar71 * auVar202;
  uVar292 = auVar9._0_8_;
  uVar295 = auVar9._8_8_;
  auVar283._8_8_ = uVar295 >> 0x34;
  auVar283._0_8_ = uVar295 * 0x1000 | uVar292 >> 0x34;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = uVar292 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar7._6_2_ & 0xf);
  auVar9 = auVar75 * ZEXT816(0x1000003d1) + auVar70 * auVar201;
  uVar292 = auVar9._0_8_;
  uVar295 = auVar9._8_8_;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = uVar297;
  auVar206._8_8_ = 0;
  auVar206._0_8_ = uVar293;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = uVar289;
  auVar207._8_8_ = 0;
  auVar207._0_8_ = uVar298;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = uVar296;
  auVar208._8_8_ = 0;
  auVar208._0_8_ = uVar3;
  auVar267._8_8_ = uVar295 >> 0x34;
  auVar267._0_8_ = uVar295 * 0x1000 | uVar292 >> 0x34;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = uVar299;
  auVar209._8_8_ = 0;
  auVar209._0_8_ = uVar4;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = uVar301;
  auVar210._8_8_ = 0;
  auVar210._0_8_ = uVar5;
  auVar283 = auVar78 * auVar208 + auVar80 * auVar210 + auVar79 * auVar209 + auVar283;
  uVar302 = auVar283._0_8_;
  uVar295 = auVar283._8_8_;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = uVar302 & 0xfffffffffffff;
  auVar267 = auVar81 * ZEXT816(0x1000003d10) + auVar77 * auVar207 + auVar76 * auVar206 + auVar267;
  auVar268._8_8_ = uVar295 >> 0x34;
  auVar268._0_8_ = uVar295 * 0x1000 | uVar302 >> 0x34;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = uVar301;
  auVar211._8_8_ = 0;
  auVar211._0_8_ = uVar293;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = uVar297;
  auVar212._8_8_ = 0;
  auVar212._0_8_ = uVar298;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = uVar289;
  auVar213._8_8_ = 0;
  auVar213._0_8_ = uVar3;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = uVar296;
  auVar214._8_8_ = 0;
  auVar214._0_8_ = uVar4;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = uVar299;
  auVar215._8_8_ = 0;
  auVar215._0_8_ = uVar5;
  auVar268 = auVar86 * auVar215 + auVar85 * auVar214 + auVar268;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = auVar268._0_8_;
  auVar9 = auVar87 * ZEXT816(0x1000003d10) +
           auVar82 * auVar211 + auVar83 * auVar212 + auVar84 * auVar213 + (auVar267 >> 0x34);
  (pre_a->x).n[0] = uVar292 & 0xfffffffffffff;
  auVar10 = auVar9 >> 0x34;
  auVar277._8_8_ = 0;
  auVar277._0_8_ = auVar10._0_8_;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = auVar268._8_8_;
  auVar276._8_8_ = auVar10._8_8_;
  auVar276._0_8_ = auVar6._0_8_ & 0xfffffffffffff;
  (pre_a->x).n[1] = auVar267._0_8_ & 0xfffffffffffff;
  auVar277 = auVar88 * ZEXT816(0x1000003d10000) + auVar276 + auVar277;
  uVar293 = auVar277._0_8_;
  (pre_a->x).n[2] = auVar9._0_8_ & 0xfffffffffffff;
  (pre_a->x).n[3] = uVar293 & 0xfffffffffffff;
  (pre_a->x).n[4] = (auVar277._8_8_ << 0xc | uVar293 >> 0x34) + (auVar7._0_8_ & 0xffffffffffff);
  uVar293 = (a->y).n[0];
  uVar291 = uVar291 & 0xfffffffffffff;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = uVar291;
  auVar216._8_8_ = 0;
  auVar216._0_8_ = uVar293;
  uVar289 = auVar8._0_8_ & 0xfffffffffffff;
  uVar298 = (a->y).n[1];
  auVar90._8_8_ = 0;
  auVar90._0_8_ = uVar289;
  auVar217._8_8_ = 0;
  auVar217._0_8_ = uVar298;
  uVar296 = auVar266._0_8_ & 0xfffffffffffff;
  uVar3 = (a->y).n[2];
  auVar91._8_8_ = 0;
  auVar91._0_8_ = uVar296;
  auVar218._8_8_ = 0;
  auVar218._0_8_ = uVar3;
  uVar290 = uVar290 & 0xfffffffffffff;
  uVar4 = (a->y).n[3];
  auVar92._8_8_ = 0;
  auVar92._0_8_ = uVar290;
  auVar219._8_8_ = 0;
  auVar219._0_8_ = uVar4;
  uVar5 = (a->y).n[4];
  auVar93._8_8_ = 0;
  auVar93._0_8_ = uVar300;
  auVar220._8_8_ = 0;
  auVar220._0_8_ = uVar5;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = SUB168(auVar93 * auVar220,0);
  auVar6 = auVar94 * ZEXT816(0x1000003d10) +
           auVar89 * auVar216 + auVar90 * auVar217 + auVar92 * auVar219 + auVar91 * auVar218;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = uVar300;
  auVar221._8_8_ = 0;
  auVar221._0_8_ = uVar293;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = uVar291;
  auVar222._8_8_ = 0;
  auVar222._0_8_ = uVar298;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = uVar289;
  auVar223._8_8_ = 0;
  auVar223._0_8_ = uVar3;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = uVar296;
  auVar224._8_8_ = 0;
  auVar224._0_8_ = uVar4;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = uVar290;
  auVar225._8_8_ = 0;
  auVar225._0_8_ = uVar5;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = SUB168(auVar93 * auVar220,8);
  auVar7 = auVar100 * ZEXT816(0x1000003d10000) +
           auVar95 * auVar221 +
           auVar96 * auVar222 + auVar97 * auVar223 + auVar99 * auVar225 + auVar98 * auVar224 +
           (auVar6 >> 0x34);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = uVar290;
  auVar226._8_8_ = 0;
  auVar226._0_8_ = uVar293;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = uVar300;
  auVar227._8_8_ = 0;
  auVar227._0_8_ = uVar298;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = uVar291;
  auVar228._8_8_ = 0;
  auVar228._0_8_ = uVar3;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = uVar289;
  auVar229._8_8_ = 0;
  auVar229._0_8_ = uVar4;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = uVar296;
  auVar230._8_8_ = 0;
  auVar230._0_8_ = uVar5;
  auVar8 = (auVar7 >> 0x34) +
           auVar103 * auVar228 + auVar105 * auVar230 + auVar104 * auVar229 + auVar102 * auVar227;
  uVar292 = auVar8._0_8_;
  uVar295 = auVar8._8_8_;
  auVar282._8_8_ = uVar295 >> 0x34;
  auVar282._0_8_ = uVar295 * 0x1000 | uVar292 >> 0x34;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = uVar292 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar7._6_2_ & 0xf);
  auVar8 = auVar101 * auVar226 + auVar106 * ZEXT816(0x1000003d1);
  uVar292 = auVar8._0_8_;
  uVar295 = auVar8._8_8_;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = uVar296;
  auVar231._8_8_ = 0;
  auVar231._0_8_ = uVar293;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = uVar290;
  auVar232._8_8_ = 0;
  auVar232._0_8_ = uVar298;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = uVar300;
  auVar233._8_8_ = 0;
  auVar233._0_8_ = uVar3;
  auVar269._8_8_ = uVar295 >> 0x34;
  auVar269._0_8_ = uVar295 * 0x1000 | uVar292 >> 0x34;
  auVar110._8_8_ = 0;
  auVar110._0_8_ = uVar291;
  auVar234._8_8_ = 0;
  auVar234._0_8_ = uVar4;
  auVar111._8_8_ = 0;
  auVar111._0_8_ = uVar289;
  auVar235._8_8_ = 0;
  auVar235._0_8_ = uVar5;
  auVar282 = auVar109 * auVar233 + auVar111 * auVar235 + auVar110 * auVar234 + auVar282;
  uVar297 = auVar282._0_8_;
  uVar295 = auVar282._8_8_;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = uVar297 & 0xfffffffffffff;
  auVar269 = auVar112 * ZEXT816(0x1000003d10) + auVar107 * auVar231 + auVar108 * auVar232 + auVar269
  ;
  auVar270._8_8_ = uVar295 >> 0x34;
  auVar270._0_8_ = uVar295 * 0x1000 | uVar297 >> 0x34;
  auVar113._8_8_ = 0;
  auVar113._0_8_ = uVar289;
  auVar236._8_8_ = 0;
  auVar236._0_8_ = uVar293;
  auVar114._8_8_ = 0;
  auVar114._0_8_ = uVar296;
  auVar237._8_8_ = 0;
  auVar237._0_8_ = uVar298;
  auVar115._8_8_ = 0;
  auVar115._0_8_ = uVar290;
  auVar238._8_8_ = 0;
  auVar238._0_8_ = uVar3;
  auVar116._8_8_ = 0;
  auVar116._0_8_ = uVar300;
  auVar239._8_8_ = 0;
  auVar239._0_8_ = uVar4;
  auVar117._8_8_ = 0;
  auVar117._0_8_ = uVar291;
  auVar240._8_8_ = 0;
  auVar240._0_8_ = uVar5;
  auVar270 = auVar117 * auVar240 + auVar116 * auVar239 + auVar270;
  auVar118._8_8_ = 0;
  auVar118._0_8_ = auVar270._0_8_;
  auVar8 = auVar118 * ZEXT816(0x1000003d10) +
           auVar113 * auVar236 + auVar114 * auVar237 + auVar115 * auVar238 + (auVar269 >> 0x34);
  (pre_a->y).n[0] = uVar292 & 0xfffffffffffff;
  auVar9 = auVar8 >> 0x34;
  auVar279._8_8_ = 0;
  auVar279._0_8_ = auVar9._0_8_;
  auVar119._8_8_ = 0;
  auVar119._0_8_ = auVar270._8_8_;
  auVar278._8_8_ = auVar9._8_8_;
  auVar278._0_8_ = auVar6._0_8_ & 0xfffffffffffff;
  (pre_a->y).n[1] = auVar269._0_8_ & 0xfffffffffffff;
  auVar279 = auVar119 * ZEXT816(0x1000003d10000) + auVar278 + auVar279;
  uVar293 = auVar279._0_8_;
  (pre_a->y).n[2] = auVar8._0_8_ & 0xfffffffffffff;
  (pre_a->y).n[3] = uVar293 & 0xfffffffffffff;
  (pre_a->y).n[4] = (auVar279._8_8_ << 0xc | uVar293 >> 0x34) + (auVar7._0_8_ & 0xffffffffffff);
  pre_a->infinity = iVar2;
  local_188.x.n[4] = (pre_a->x).n[4];
  local_188.x.n[0] = (pre_a->x).n[0];
  local_188.x.n[1] = (pre_a->x).n[1];
  local_188.x.n[2] = (pre_a->x).n[2];
  local_188.x.n[3] = (pre_a->x).n[3];
  local_188.y.n[0] = (pre_a->y).n[0];
  local_188.y.n[1] = (pre_a->y).n[1];
  local_188.y.n[2] = (pre_a->y).n[2];
  local_188.y.n[3] = (pre_a->y).n[3];
  local_188.y.n[4] = (pre_a->y).n[4];
  local_188.z.n[0] = (a->z).n[0];
  local_188.z.n[1] = (a->z).n[1];
  local_188.z.n[2] = (a->z).n[2];
  local_188.z.n[3] = (a->z).n[3];
  local_188.z.n[4] = (a->z).n[4];
  zr->n[4] = local_108.z.n[4];
  zr->n[2] = local_108.z.n[2];
  zr->n[3] = local_108.z.n[3];
  zr->n[0] = local_108.z.n[0];
  zr->n[1] = local_108.z.n[1];
  if (1 < n) {
    lVar294 = 0x58;
    local_188.infinity = iVar2;
    do {
      zr = zr + 1;
      secp256k1_gej_add_ge_var(&local_188,&local_188,&local_88,zr);
      *(undefined4 *)((long)(&pre_a->y + 1) + lVar294) = 0;
      puVar1 = (uint64_t *)((long)(pre_a->x).n + lVar294);
      *puVar1 = local_188.x.n[0];
      puVar1[1] = local_188.x.n[1];
      puVar1 = (uint64_t *)((long)(pre_a->x).n + lVar294 + 0x10);
      *puVar1 = local_188.x.n[2];
      puVar1[1] = local_188.x.n[3];
      *(uint64_t *)((long)(pre_a->x).n + lVar294 + 0x20) = local_188.x.n[4];
      puVar1 = (uint64_t *)((long)(pre_a->y).n + lVar294);
      *puVar1 = local_188.y.n[0];
      puVar1[1] = local_188.y.n[1];
      puVar1 = (uint64_t *)((long)(pre_a->y).n + lVar294 + 0x10);
      *puVar1 = local_188.y.n[2];
      puVar1[1] = local_188.y.n[3];
      *(uint64_t *)((long)(pre_a->y).n + lVar294 + 0x20) = local_188.y.n[4];
      lVar294 = lVar294 + 0x58;
    } while ((ulong)(uint)n * 0x58 - lVar294 != 0);
  }
  auVar120._8_8_ = 0;
  auVar120._0_8_ = local_188.z.n[0];
  auVar241._8_8_ = 0;
  auVar241._0_8_ = uVar287;
  auVar121._8_8_ = 0;
  auVar121._0_8_ = local_188.z.n[1];
  auVar242._8_8_ = 0;
  auVar242._0_8_ = uVar286;
  auVar122._8_8_ = 0;
  auVar122._0_8_ = local_188.z.n[2];
  auVar243._8_8_ = 0;
  auVar243._0_8_ = uVar285;
  auVar123._8_8_ = 0;
  auVar123._0_8_ = local_188.z.n[3];
  auVar244._8_8_ = 0;
  auVar244._0_8_ = uVar284;
  auVar124._8_8_ = 0;
  auVar124._0_8_ = local_188.z.n[4];
  auVar245._8_8_ = 0;
  auVar245._0_8_ = uVar288;
  auVar125._8_8_ = 0;
  auVar125._0_8_ = SUB168(auVar124 * auVar245,0);
  auVar9 = auVar121 * auVar242 + auVar120 * auVar241 + auVar122 * auVar243 + auVar123 * auVar244 +
           auVar125 * ZEXT816(0x1000003d10);
  auVar126._8_8_ = 0;
  auVar126._0_8_ = local_188.z.n[0];
  auVar246._8_8_ = 0;
  auVar246._0_8_ = uVar288;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = local_188.z.n[1];
  auVar247._8_8_ = 0;
  auVar247._0_8_ = uVar287;
  auVar128._8_8_ = 0;
  auVar128._0_8_ = local_188.z.n[2];
  auVar248._8_8_ = 0;
  auVar248._0_8_ = uVar286;
  auVar129._8_8_ = 0;
  auVar129._0_8_ = local_188.z.n[3];
  auVar249._8_8_ = 0;
  auVar249._0_8_ = uVar285;
  auVar130._8_8_ = 0;
  auVar130._0_8_ = local_188.z.n[4];
  auVar250._8_8_ = 0;
  auVar250._0_8_ = uVar284;
  auVar131._8_8_ = 0;
  auVar131._0_8_ = SUB168(auVar124 * auVar245,8);
  auVar6 = auVar131 * ZEXT816(0x1000003d10000) +
           auVar130 * auVar250 +
           auVar129 * auVar249 + auVar128 * auVar248 + auVar127 * auVar247 + auVar126 * auVar246 +
           (auVar9 >> 0x34);
  auVar132._8_8_ = 0;
  auVar132._0_8_ = local_188.z.n[0];
  auVar251._8_8_ = 0;
  auVar251._0_8_ = uVar284;
  auVar133._8_8_ = 0;
  auVar133._0_8_ = local_188.z.n[1];
  auVar252._8_8_ = 0;
  auVar252._0_8_ = uVar288;
  auVar134._8_8_ = 0;
  auVar134._0_8_ = local_188.z.n[2];
  auVar253._8_8_ = 0;
  auVar253._0_8_ = uVar287;
  auVar135._8_8_ = 0;
  auVar135._0_8_ = local_188.z.n[3];
  auVar254._8_8_ = 0;
  auVar254._0_8_ = uVar286;
  auVar136._8_8_ = 0;
  auVar136._0_8_ = local_188.z.n[4];
  auVar255._8_8_ = 0;
  auVar255._0_8_ = uVar285;
  auVar7 = auVar136 * auVar255 + auVar135 * auVar254 + auVar134 * auVar253 + auVar133 * auVar252 +
           (auVar6 >> 0x34);
  auVar137._8_8_ = 0;
  auVar137._0_8_ = (auVar7._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar6._6_2_ & 0xf);
  auVar8 = auVar132 * auVar251 + auVar137 * ZEXT816(0x1000003d1);
  uVar293 = auVar8._0_8_;
  uVar298 = auVar8._8_8_;
  auVar138._8_8_ = 0;
  auVar138._0_8_ = local_188.z.n[0];
  auVar256._8_8_ = 0;
  auVar256._0_8_ = uVar285;
  auVar139._8_8_ = 0;
  auVar139._0_8_ = local_188.z.n[1];
  auVar257._8_8_ = 0;
  auVar257._0_8_ = uVar284;
  auVar271._8_8_ = uVar298 >> 0x34;
  auVar271._0_8_ = uVar298 * 0x1000 | uVar293 >> 0x34;
  auVar140._8_8_ = 0;
  auVar140._0_8_ = local_188.z.n[2];
  auVar258._8_8_ = 0;
  auVar258._0_8_ = uVar288;
  auVar141._8_8_ = 0;
  auVar141._0_8_ = local_188.z.n[3];
  auVar259._8_8_ = 0;
  auVar259._0_8_ = uVar287;
  auVar142._8_8_ = 0;
  auVar142._0_8_ = local_188.z.n[4];
  auVar260._8_8_ = 0;
  auVar260._0_8_ = uVar286;
  auVar7 = auVar142 * auVar260 + auVar141 * auVar259 + auVar140 * auVar258 + (auVar7 >> 0x34);
  auVar143._8_8_ = 0;
  auVar143._0_8_ = auVar7._0_8_ & 0xfffffffffffff;
  auVar271 = auVar143 * ZEXT816(0x1000003d10) + auVar138 * auVar256 + auVar139 * auVar257 + auVar271
  ;
  auVar144._8_8_ = 0;
  auVar144._0_8_ = local_188.z.n[0];
  auVar261._8_8_ = 0;
  auVar261._0_8_ = uVar286;
  auVar145._8_8_ = 0;
  auVar145._0_8_ = local_188.z.n[1];
  auVar262._8_8_ = 0;
  auVar262._0_8_ = uVar285;
  auVar146._8_8_ = 0;
  auVar146._0_8_ = local_188.z.n[2];
  auVar263._8_8_ = 0;
  auVar263._0_8_ = uVar284;
  auVar147._8_8_ = 0;
  auVar147._0_8_ = local_188.z.n[3];
  auVar264._8_8_ = 0;
  auVar264._0_8_ = uVar288;
  auVar148._8_8_ = 0;
  auVar148._0_8_ = local_188.z.n[4];
  auVar265._8_8_ = 0;
  auVar265._0_8_ = uVar287;
  auVar7 = auVar148 * auVar265 + auVar147 * auVar264 + (auVar7 >> 0x34);
  z->n[0] = uVar293 & 0xfffffffffffff;
  auVar149._8_8_ = 0;
  auVar149._0_8_ = auVar7._0_8_;
  z->n[1] = auVar271._0_8_ & 0xfffffffffffff;
  auVar8 = auVar149 * ZEXT816(0x1000003d10) +
           auVar146 * auVar263 + auVar144 * auVar261 + auVar145 * auVar262 + (auVar271 >> 0x34);
  auVar10 = auVar8 >> 0x34;
  auVar281._8_8_ = 0;
  auVar281._0_8_ = auVar10._0_8_;
  z->n[2] = auVar8._0_8_ & 0xfffffffffffff;
  auVar150._8_8_ = 0;
  auVar150._0_8_ = auVar7._8_8_;
  auVar280._8_8_ = auVar10._8_8_;
  auVar280._0_8_ = auVar9._0_8_ & 0xfffffffffffff;
  auVar281 = auVar150 * ZEXT816(0x1000003d10000) + auVar280 + auVar281;
  uVar293 = auVar281._0_8_;
  z->n[3] = uVar293 & 0xfffffffffffff;
  z->n[4] = (auVar281._8_8_ << 0xc | uVar293 >> 0x34) + (auVar6._0_8_ & 0xffffffffffff);
  return;
}

Assistant:

static void secp256k1_ecmult_odd_multiples_table(int n, secp256k1_ge *pre_a, secp256k1_fe *zr, secp256k1_fe *z, const secp256k1_gej *a) {
    secp256k1_gej d, ai;
    secp256k1_ge d_ge;
    int i;

    VERIFY_CHECK(!a->infinity);

    secp256k1_gej_double_var(&d, a, NULL);

    /*
     * Perform the additions using an isomorphic curve Y^2 = X^3 + 7*C^6 where C := d.z.
     * The isomorphism, phi, maps a secp256k1 point (x, y) to the point (x*C^2, y*C^3) on the other curve.
     * In Jacobian coordinates phi maps (x, y, z) to (x*C^2, y*C^3, z) or, equivalently to (x, y, z/C).
     *
     *     phi(x, y, z) = (x*C^2, y*C^3, z) = (x, y, z/C)
     *   d_ge := phi(d) = (d.x, d.y, 1)
     *     ai := phi(a) = (a.x*C^2, a.y*C^3, a.z)
     *
     * The group addition functions work correctly on these isomorphic curves.
     * In particular phi(d) is easy to represent in affine coordinates under this isomorphism.
     * This lets us use the faster secp256k1_gej_add_ge_var group addition function that we wouldn't be able to use otherwise.
     */
    secp256k1_ge_set_xy(&d_ge, &d.x, &d.y);
    secp256k1_ge_set_gej_zinv(&pre_a[0], a, &d.z);
    secp256k1_gej_set_ge(&ai, &pre_a[0]);
    ai.z = a->z;

    /* pre_a[0] is the point (a.x*C^2, a.y*C^3, a.z*C) which is equivalent to a.
     * Set zr[0] to C, which is the ratio between the omitted z(pre_a[0]) value and a.z.
     */
    zr[0] = d.z;

    for (i = 1; i < n; i++) {
        secp256k1_gej_add_ge_var(&ai, &ai, &d_ge, &zr[i]);
        secp256k1_ge_set_xy(&pre_a[i], &ai.x, &ai.y);
    }

    /* Multiply the last z-coordinate by C to undo the isomorphism.
     * Since the z-coordinates of the pre_a values are implied by the zr array of z-coordinate ratios,
     * undoing the isomorphism here undoes the isomorphism for all pre_a values.
     */
    secp256k1_fe_mul(z, &ai.z, &d.z);
}